

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::AddBlockToLoop(FlowGraph *this,BasicBlock *block,Loop *loop)

{
  Loop *loop_local;
  BasicBlock *block_local;
  FlowGraph *this_local;
  
  loop_local = (Loop *)block;
  block_local = (BasicBlock *)this;
  SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&loop->blockList,(BasicBlock **)&loop_local);
  if (((ushort)loop_local->loopNumber >> 3 & 1) != 0) {
    Loop::SetHasCall(loop);
  }
  if (((ushort)loop_local->loopNumber >> 4 & 1) != 0) {
    Loop::SetHasYield(loop);
  }
  return;
}

Assistant:

void
FlowGraph::AddBlockToLoop(BasicBlock *block, Loop *loop)
{
    loop->blockList.Prepend(block);
    if (block->hasCall)
    {
        loop->SetHasCall();
    }
    if (block->hasYield)
    {
        loop->SetHasYield();
    }
}